

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O3

void __thiscall viface::VIfaceImpl::VIfaceImpl(VIfaceImpl *this,string *name,bool tap,int id)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  VIfaceImpl *pVVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  long *plVar10;
  ssize_t sVar11;
  ulong uVar12;
  string *psVar13;
  invalid_argument *this_00;
  int *piVar14;
  char *pcVar15;
  ostream *poVar16;
  runtime_error *prVar17;
  ulong *puVar18;
  uint uVar19;
  bool bVar20;
  ifreq ifr;
  ostringstream what;
  char buffer [4237];
  undefined1 auStack_2e8 [8];
  int local_2e0;
  uint local_2dc;
  VIfaceImpl *local_2d8;
  int local_2cc;
  ulong *local_2c8;
  long lStack_2c0;
  ulong uStack_2b8;
  long lStack_2b0;
  undefined8 uStack_2a8;
  string *local_298;
  uint local_28c;
  char *local_288;
  long local_280;
  char local_278 [16];
  char *local_268;
  long local_260;
  char local_258 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [3];
  ios_base local_190 [264];
  string *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_228 = &this->pktbuff;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = (string *)&this->name;
  local_60 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_60;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->mac).field_2;
  (this->mac)._M_dataplus._M_p = (pointer)local_68;
  (this->mac)._M_string_length = 0;
  (this->mac).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->ipv4).field_2;
  (this->ipv4)._M_dataplus._M_p = (pointer)local_70;
  (this->ipv4)._M_string_length = 0;
  (this->ipv4).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->netmask).field_2;
  (this->netmask)._M_dataplus._M_p = (pointer)local_78;
  (this->netmask)._M_string_length = 0;
  (this->netmask).field_2._M_local_buf[0] = '\0';
  local_80 = &(this->broadcast).field_2;
  (this->broadcast)._M_dataplus._M_p = (pointer)local_80;
  (this->broadcast)._M_string_length = 0;
  (this->broadcast).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ipv6s)._M_t._M_impl.super__Rb_tree_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stats_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d8 = this;
  if (0xf < name->_M_string_length) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"--- Virtual interface name too long.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_2e0 = 0;
  local_2cc = 0;
  local_28c = id;
  std::operator+(local_200,"/sys/class/net/",name);
  iVar6 = access(local_200[0]._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
    operator_delete(local_200[0]._M_dataplus._M_p);
  }
  if (iVar6 != 0) {
    local_288 = local_278;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar2,pcVar2 + name->_M_string_length);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    lStack_2c0 = 0;
    lStack_2b0 = 0;
    uStack_2a8 = 0;
    uStack_2b8 = (ulong)(ushort)(tap + 0x1101);
    strncpy((char *)&local_2c8,local_288,0xf);
    local_2dc = 0;
    iVar6 = 0;
    piVar14 = &local_2e0;
    bVar5 = true;
    do {
      bVar20 = bVar5;
      iVar7 = open("/dev/net/tun",0x802);
      if (iVar7 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,"--- Unable to open TUN/TAP device.",0x22);
        std::endl<char,std::char_traits<char>>((ostream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Name: ",10);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,local_288,local_280);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar6);
        std::endl<char,std::char_traits<char>>(poVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
        piVar14 = __errno_location();
        pcVar15 = strerror(*piVar14);
        std::operator<<((ostream *)local_200,pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
LAB_0010765f:
        std::endl<char,std::char_traits<char>>(poVar16);
LAB_00107667:
        if ((local_2dc & 1) != 0) {
          iVar6 = close(local_2e0);
          if (iVar6 < 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"--- Unable to close a TUN/TAP device.",0x25);
            std::endl<char,std::char_traits<char>>((ostream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Name: ",10)
            ;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_200,local_288,local_280);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,0);
            std::endl<char,std::char_traits<char>>(poVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"    Error: ",0xb);
            piVar14 = __errno_location();
            pcVar15 = strerror(*piVar14);
            std::operator<<((ostream *)local_200,pcVar15);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
            poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
            std::endl<char,std::char_traits<char>>(poVar16);
          }
        }
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar17,(string *)&local_220);
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar8 = ioctl(iVar7,0x400454ca,&local_2c8);
      if (iVar8 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,"--- Unable to register a TUN/TAP device.",0x28);
        std::endl<char,std::char_traits<char>>((ostream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Name: ",10);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,local_288,local_280);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar6);
        std::endl<char,std::char_traits<char>>(poVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
        piVar14 = __errno_location();
        pcVar15 = strerror(*piVar14);
        std::operator<<((ostream *)local_200,pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
        std::endl<char,std::char_traits<char>>(poVar16);
        iVar7 = close(iVar7);
        if (-1 < iVar7) goto LAB_00107667;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,"--- Unable to close a TUN/TAP device.",0x25);
        std::endl<char,std::char_traits<char>>((ostream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Name: ",10);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,local_288,local_280);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar6);
        std::endl<char,std::char_traits<char>>(poVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
        pcVar15 = strerror(*piVar14);
        std::operator<<((ostream *)local_200,pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
        goto LAB_0010765f;
      }
      *piVar14 = iVar7;
      iVar6 = 1;
      local_2dc = 1;
      piVar14 = &local_2cc;
      bVar5 = false;
    } while (bVar20);
    local_58[0] = local_48;
    sVar9 = strlen((char *)&local_2c8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,&local_2c8,(long)&local_2c8 + sVar9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    std::__cxx11::string::operator=(local_298,(string *)local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    if (local_288 != local_278) {
      operator_delete(local_288);
    }
    local_2d8->mtu = 0x5dc;
    goto LAB_001074e5;
  }
  local_268 = local_258;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar2,pcVar2 + name->_M_string_length);
  local_88 = name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  piVar14 = &local_2e0;
  iVar6 = 0;
  bVar5 = true;
  uVar19 = 0;
  do {
    local_2dc = uVar19;
    bVar20 = bVar5;
    iVar7 = socket(0x11,3,0x300);
    if (iVar7 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,"--- Unable to create the Tx/Rx socket channel.",0x2e);
      std::endl<char,std::char_traits<char>>((ostream *)local_200);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Name: ",10);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar6);
      std::endl<char,std::char_traits<char>>(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
      piVar14 = __errno_location();
      pcVar15 = strerror(*piVar14);
      std::operator<<((ostream *)local_200,pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
      std::endl<char,std::char_traits<char>>(poVar16);
      goto LAB_00107ad9;
    }
    uStack_2b8 = 0;
    lStack_2b0 = 0;
    local_2c8 = (ulong *)0x0;
    lStack_2c0 = 0;
    uStack_2a8 = 0;
    strncpy((char *)&local_2c8,local_268,0xf);
    iVar8 = ioctl(iVar7,0x8933,&local_2c8);
    if (iVar8 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,"--- Unable to get network index number.",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Name: ",10);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
      plVar10 = (long *)std::ostream::operator<<(poVar16,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
      psVar13 = (string *)__errno_location();
      pcVar15 = strerror(*(int *)psVar13);
      if (pcVar15 != (char *)0x0) goto LAB_00108365;
      std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_200[0]._M_dataplus._M_p + -0x18)
                      + 0xe8);
      goto LAB_00108383;
    }
    local_220.field_2._M_allocated_capacity._0_4_ = 0;
    local_220._M_string_length = 0;
    local_220._M_dataplus._M_p._0_4_ = 0x3000011;
    local_220._M_dataplus._M_p._4_4_ = (undefined4)uStack_2b8;
    iVar8 = bind(iVar7,(sockaddr *)&local_220,0x14);
    if (iVar8 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,"--- Unable to bind the Tx/Rx socket channel to the \'",0x34);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Queue: ",0xb);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
      piVar14 = __errno_location();
      pcVar15 = strerror(*piVar14);
      if (pcVar15 == (char *)0x0) {
        std::ios::clear((int)auStack_2e8 +
                        (int)*(undefined8 *)(local_200[0]._M_dataplus._M_p + -0x18) + 0xe8);
      }
      else {
        sVar9 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,pcVar15,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      goto LAB_00107ad9;
    }
    *piVar14 = iVar7;
    iVar6 = 1;
    piVar14 = &local_2cc;
    bVar5 = false;
    uVar19 = 1;
  } while (bVar20);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base(local_190);
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  psVar4 = local_88;
  std::__cxx11::string::_M_assign(local_298);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar2,pcVar2 + psVar4->_M_string_length);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  std::operator+(&local_220,"/sys/class/net/",&local_248);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_220);
  puVar18 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar18) {
    uStack_2b8 = *puVar18;
    lStack_2b0 = plVar10[3];
    local_2c8 = &uStack_2b8;
  }
  else {
    uStack_2b8 = *puVar18;
    local_2c8 = (ulong *)*plVar10;
  }
  lStack_2c0 = plVar10[1];
  *plVar10 = (long)puVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  iVar6 = open((char *)local_2c8,0x800);
  if (local_2c8 != &uStack_2b8) {
    operator_delete(local_2c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_) !=
      &local_220.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_));
  }
  if (iVar6 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,"--- Unable to open MTU file for \'",0x21);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_200,local_248._M_dataplus._M_p,local_248._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
    std::endl<char,std::char_traits<char>>(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_200,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
LAB_00108302:
    std::endl<char,std::char_traits<char>>(poVar16);
    close(iVar6);
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar11 = read(iVar6,local_58,4);
  local_58[0]._0_5_ = (uint5)(uint)local_58[0];
  if ((int)sVar11 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,"--- Unable to read MTU for \'",0x1c);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_200,local_248._M_dataplus._M_p,local_248._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
    std::endl<char,std::char_traits<char>>(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_200,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    goto LAB_00108302;
  }
  iVar7 = close(iVar6);
  if (iVar7 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,"--- Unable to close MTU file for \'",0x22);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_200,local_248._M_dataplus._M_p,local_248._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
    std::endl<char,std::char_traits<char>>(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_200,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    goto LAB_00108302;
  }
  psVar13 = (string *)&local_2c8;
  local_2c8 = &uStack_2b8;
  sVar9 = strlen((char *)local_58);
  std::__cxx11::string::_M_construct<char_const*>(psVar13,local_58,(long)local_58 + sVar9);
  puVar18 = local_2c8;
  piVar14 = __errno_location();
  iVar6 = *piVar14;
  *piVar14 = 0;
  uVar12 = strtoul((char *)puVar18,(char **)&local_220,10);
  if ((ulong *)CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_) ==
      puVar18) {
    pcVar15 = (char *)std::__throw_invalid_argument("stoul");
LAB_00108365:
    sVar9 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,pcVar15,sVar9);
LAB_00108383:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*(int *)psVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
LAB_00107ad9:
    if ((local_2dc & 1) != 0) {
      iVar6 = close(local_2e0);
      if (iVar6 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,"--- Unable to close a Rx/Tx socket.",0x23);
        std::endl<char,std::char_traits<char>>((ostream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Name: ",10);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,local_268,local_260);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,0);
        std::endl<char,std::char_traits<char>>(poVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
        piVar14 = __errno_location();
        pcVar15 = strerror(*piVar14);
        std::operator<<((ostream *)local_200,pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
        std::endl<char,std::char_traits<char>>(poVar16);
      }
    }
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar19 = (uint)uVar12;
  if (*piVar14 == 0) {
LAB_0010746e:
    *piVar14 = iVar6;
  }
  else if (*piVar14 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_0010746e;
  }
  if (local_2c8 != &uStack_2b8) {
    operator_delete(local_2c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base(local_190);
  pVVar3 = local_2d8;
  local_2d8->mtu = uVar19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
    uVar19 = pVVar3->mtu;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_228,(ulong)uVar19);
LAB_001074e5:
  pVVar3 = local_2d8;
  (local_2d8->queues).rx = local_2e0;
  (local_2d8->queues).tx = local_2cc;
  local_2d8->kernel_socket = -1;
  iVar6 = socket(2,1,0);
  pVVar3->kernel_socket = iVar6;
  if (iVar6 < 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,"--- Unable to create IPv4 socket channel to the NET kernel.",
               0x3b);
    std::endl<char,std::char_traits<char>>((ostream *)local_200);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_200,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    std::endl<char,std::char_traits<char>>(poVar16);
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar3->kernel_socket_ipv6 = -1;
  iVar6 = socket(10,1,0);
  pVVar3->kernel_socket_ipv6 = iVar6;
  if (-1 < iVar6) {
    if ((int)local_28c < 0) {
      local_28c = idseq;
    }
    pVVar3->id = local_28c;
    idseq = idseq + 1;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_200,"--- Unable to create IPv6 socket channel to the NET kernel.",0x3b
            );
  std::endl<char,std::char_traits<char>>((ostream *)local_200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"    Error: ",0xb);
  piVar14 = __errno_location();
  pcVar15 = strerror(*piVar14);
  std::operator<<((ostream *)local_200,pcVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," (",2);
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_200,*piVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
  std::endl<char,std::char_traits<char>>(poVar16);
  prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
  __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VIfaceImpl::VIfaceImpl(string name, bool tap, int id)
{
    // Check name length
    if (name.length() >= IFNAMSIZ) {
        throw invalid_argument("--- Virtual interface name too long.");
    }

    // Create queues
    struct viface_queues queues;
    memset(&queues, 0, sizeof(struct viface_queues));

    /* Checks if the path name can be accessed. If so,
     * it means that the network interface is already defined.
     */
    if (access(("/sys/class/net/" + name).c_str(), F_OK) == 0) {
        hook_viface(name, &queues);
        this->name = name;

        // Read MTU value and resize buffer
        this->mtu = read_mtu(name, sizeof(this->mtu));
        this->pktbuff.resize(this->mtu);
    } else {
        this->name = alloc_viface(name, tap, &queues);

        // Other defaults
        this->mtu = 1500;
    }

    this->queues = queues;

    // Create socket channels to the NET kernel for later ioctl
    this->kernel_socket = -1;
    this->kernel_socket = socket(AF_INET, SOCK_STREAM, 0);
    if (this->kernel_socket < 0) {
        ostringstream what;
        what << "--- Unable to create IPv4 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    this->kernel_socket_ipv6 = -1;
    this->kernel_socket_ipv6 = socket(AF_INET6, SOCK_STREAM, 0);
    if (this->kernel_socket_ipv6 < 0) {
        ostringstream what;
        what << "--- Unable to create IPv6 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Set id
    if (id < 0) {
        this->id = this->idseq;
    } else {
        this->id = id;
    }
    this->idseq++;
}